

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EfiTianoDecompress.c
# Opt level: O2

UINT32 GetBits(SCRATCH_DATA *Sd,UINT16 NumOfBits)

{
  uint uVar1;
  
  uVar1 = Sd->mBitBuf;
  FillBuf(Sd,NumOfBits);
  return uVar1 >> (-(char)NumOfBits & 0x1fU);
}

Assistant:

STATIC
UINT32
GetBits (
    IN  SCRATCH_DATA  *Sd,
    IN  UINT16        NumOfBits
    )
{
    UINT32  OutBits;

    //
    // Pop NumOfBits of Bits from Left
    //
    OutBits = (UINT32)(Sd->mBitBuf >> (BITBUFSIZ - NumOfBits));

    //
    // Fill up mBitBuf from source
    //
    FillBuf (Sd, NumOfBits);

    return OutBits;
}